

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gi.c
# Opt level: O2

void golf_gi_deinit(golf_gi_t *gi)

{
  golf_gi_lightmap_section_t *mem;
  int i_1;
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  golf_gi_entity_t *pgVar4;
  
  for (lVar2 = 0; pgVar4 = (gi->entities).data, lVar2 < (gi->entities).length; lVar2 = lVar2 + 1) {
    pgVar4 = pgVar4 + lVar2;
    lVar3 = 0x80;
    for (lVar1 = 0; mem = (pgVar4->gi_lightmap_sections).data,
        lVar1 < (pgVar4->gi_lightmap_sections).length; lVar1 = lVar1 + 1) {
      golf_free_tracked(*(void **)((long)mem + lVar3 + -0x30));
      golf_free_tracked(*(void **)((long)mem + lVar3 + -0x18));
      golf_free_tracked(*(void **)((long)&(mem->transform).position.x + lVar3));
      lVar3 = lVar3 + 0xa8;
    }
    golf_free_tracked(mem);
    golf_free_tracked((pgVar4->positions).data);
    golf_free_tracked((pgVar4->normals).data);
    golf_free_tracked((pgVar4->lightmap_uvs).data);
    golf_free_tracked((pgVar4->ignore).data);
  }
  golf_free_tracked(pgVar4);
  golf_thread_join(gi->thread);
  golf_thread_destroy(gi->thread);
  return;
}

Assistant:

void golf_gi_deinit(golf_gi_t *gi) {
    for (int i = 0; i < gi->entities.length; i++) {
        golf_gi_entity_t *entity = &gi->entities.data[i];
        for (int i = 0; i < entity->gi_lightmap_sections.length; i++) {
            golf_gi_lightmap_section_t *section = &entity->gi_lightmap_sections.data[i];
            vec_deinit(&section->positions);
            vec_deinit(&section->normals);
            vec_deinit(&section->lightmap_uvs);
        }
        vec_deinit(&entity->gi_lightmap_sections);
        vec_deinit(&entity->positions);
        vec_deinit(&entity->normals);
        vec_deinit(&entity->lightmap_uvs);
        vec_deinit(&entity->ignore);
    }
    vec_deinit(&gi->entities);
    golf_thread_join(gi->thread);
    golf_thread_destroy(gi->thread);
}